

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cdata.c
# Opt level: O3

GCcdata * lj_cdata_newref(CTState *cts,void *p,CTypeID id)

{
  CTypeID CVar1;
  GCcdata *pGVar2;
  
  CVar1 = lj_ctype_intern(cts,id + 0x22830000,8);
  pGVar2 = (GCcdata *)lj_mem_newgco(cts->L,0x18);
  pGVar2->gct = '\n';
  pGVar2->ctypeid = (uint16_t)CVar1;
  pGVar2[1].nextgc.gcptr64 = (uint64_t)p;
  return pGVar2;
}

Assistant:

GCcdata *lj_cdata_newref(CTState *cts, const void *p, CTypeID id)
{
  CTypeID refid = lj_ctype_intern(cts, CTINFO_REF(id), CTSIZE_PTR);
  GCcdata *cd = lj_cdata_new(cts, refid, CTSIZE_PTR);
  *(const void **)cdataptr(cd) = p;
  return cd;
}